

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O0

int Wln_NtkMemUsage(Wln_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int Mem;
  Wln_Ntk_t *p_local;
  
  iVar1 = (p->vCis).nCap;
  iVar2 = (p->vCos).nCap;
  iVar3 = (p->vFfs).nCap;
  iVar4 = (p->vTypes).nCap;
  iVar5 = (p->vRanges).nCap;
  iVar6 = (p->vNameIds).nCap;
  iVar7 = (p->vInstIds).nCap;
  iVar8 = (p->vTravIds).nCap;
  iVar9 = (p->vCopies).nCap;
  iVar10 = (p->vBits).nCap;
  iVar11 = (p->vLevels).nCap;
  iVar12 = (p->vRefs).nCap;
  iVar13 = (p->vFanout).nCap;
  iVar14 = (p->vFaninAttrs).nCap;
  iVar15 = (p->vFaninLists).nCap;
  iVar16 = Hash_IntManEntryNum(p->pRanges);
  iVar17 = Abc_NamMemUsed(p->pManName);
  return iVar17 + iVar16 * 0x14 +
                  iVar15 * 4 +
                  iVar14 * 4 +
                  iVar13 * 4 +
                  iVar12 * 4 +
                  iVar11 * 4 +
                  iVar10 * 4 +
                  iVar9 * 4 +
                  iVar8 * 4 +
                  iVar7 * 4 +
                  iVar6 * 4 + iVar5 * 4 + iVar4 + iVar3 * 4 + iVar2 * 4 + iVar1 * 4 + 0x458;
}

Assistant:

int Wln_NtkMemUsage( Wln_Ntk_t * p )
{
    int Mem = sizeof(Wln_Ntk_t);
    Mem += 4 * p->vCis.nCap;
    Mem += 4 * p->vCos.nCap;
    Mem += 4 * p->vFfs.nCap;
    Mem += 1 * p->vTypes.nCap;
    Mem += 4 * p->vRanges.nCap;
    Mem += 4 * p->vNameIds.nCap;
    Mem += 4 * p->vInstIds.nCap;
    Mem += 4 * p->vTravIds.nCap;
    Mem += 4 * p->vCopies.nCap;
    Mem += 4 * p->vBits.nCap;
    Mem += 4 * p->vLevels.nCap;
    Mem += 4 * p->vRefs.nCap;
    Mem += 4 * p->vFanout.nCap;
    Mem += 4 * p->vFaninAttrs.nCap;
    Mem += 4 * p->vFaninLists.nCap;
    Mem += 20 * Hash_IntManEntryNum(p->pRanges);
    Mem += Abc_NamMemUsed(p->pManName);
    return Mem;
}